

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  RepeatedPtrFieldBase *pRVar4;
  MapFieldBase *pMVar5;
  MapFieldBase *pMVar6;
  RepeatedPtrFieldBase *pRVar7;
  RepeatedPtrFieldBase *this_00;
  long *__a;
  long *__b;
  uint *__a_00;
  uint *__b_00;
  unsigned_long *__a_01;
  unsigned_long *__b_01;
  float *__a_02;
  float *__b_02;
  double *__a_03;
  double *__b_03;
  bool *__a_04;
  bool *__b_04;
  int *piVar8;
  int *piVar9;
  Arena *pAVar10;
  Arena *pAVar11;
  Message **ppMVar12;
  Message **ppMVar13;
  undefined8 uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InlinedStringField *pIVar15;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  string *psVar16;
  LogMessage *pLVar17;
  FieldDescriptor *in_RCX;
  long *in_RDX;
  long *in_RSI;
  string temp;
  string *default_ptr;
  ArenaStringPtr *string2;
  ArenaStringPtr *string1;
  InlinedStringField *string2_1;
  InlinedStringField *string1_1;
  Arena *arena2;
  Arena *arena1;
  Message **sub_msg2;
  Message **sub_msg1;
  Arena *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string *in_stack_fffffffffffffd68;
  Reflection *in_stack_fffffffffffffd70;
  RepeatedField<int> *in_stack_fffffffffffffd88;
  RepeatedField<int> *in_stack_fffffffffffffd90;
  Message *pMVar18;
  FieldDescriptor *in_stack_fffffffffffffdd0;
  Message *in_stack_fffffffffffffdd8;
  Reflection *in_stack_fffffffffffffde0;
  RepeatedPtrFieldBase *in_stack_fffffffffffffde8;
  LogMessage *in_stack_fffffffffffffdf0;
  RepeatedPtrFieldBase *in_stack_fffffffffffffe18;
  RepeatedPtrFieldBase *in_stack_fffffffffffffe20;
  undefined1 local_158 [56];
  string local_120 [32];
  string *local_100;
  ArenaStringPtr *local_f8;
  Message *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  Reflection *in_stack_ffffffffffffff20;
  
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x419c24);
  if (bVar1) {
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x419c3a);
    switch(CVar2) {
    case CPPTYPE_INT32:
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<int>::Swap(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_INT64:
      MutableRaw<google::protobuf::RepeatedField<long>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<long>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<long>::Swap
                ((RepeatedField<long> *)in_stack_fffffffffffffd90,
                 (RepeatedField<long> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_UINT32:
      MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<unsigned_int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<unsigned_int>::Swap
                ((RepeatedField<unsigned_int> *)in_stack_fffffffffffffd90,
                 (RepeatedField<unsigned_int> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_UINT64:
      MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<unsigned_long>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<unsigned_long>::Swap
                ((RepeatedField<unsigned_long> *)in_stack_fffffffffffffd90,
                 (RepeatedField<unsigned_long> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_DOUBLE:
      MutableRaw<google::protobuf::RepeatedField<double>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<double>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<double>::Swap
                ((RepeatedField<double> *)in_stack_fffffffffffffd90,
                 (RepeatedField<double> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_FLOAT:
      MutableRaw<google::protobuf::RepeatedField<float>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<float>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<float>::Swap
                ((RepeatedField<float> *)in_stack_fffffffffffffd90,
                 (RepeatedField<float> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_BOOL:
      MutableRaw<google::protobuf::RepeatedField<bool>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<bool>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<bool>::Swap
                ((RepeatedField<bool> *)in_stack_fffffffffffffd90,
                 (RepeatedField<bool> *)in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_ENUM:
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      MutableRaw<google::protobuf::RepeatedField<int>>
                (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                 (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      RepeatedField<int>::Swap(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      break;
    case CPPTYPE_STRING:
      FieldDescriptor::options(in_RCX);
      FieldOptions::ctype((FieldOptions *)0x419f34);
      pRVar4 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      pRVar7 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      pAVar10 = internal::RepeatedPtrFieldBase::GetArenaNoVirtual(pRVar7);
      pAVar11 = internal::RepeatedPtrFieldBase::GetArenaNoVirtual(pRVar4);
      if (pAVar10 == pAVar11) {
        internal::RepeatedPtrFieldBase::InternalSwap
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      else {
        internal::RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      }
      break;
    case CPPTYPE_MESSAGE:
      bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x41a018);
      if (bVar1) {
        pMVar5 = MutableRaw<google::protobuf::internal::MapFieldBase>
                           (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                            (FieldDescriptor *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        pMVar6 = MutableRaw<google::protobuf::internal::MapFieldBase>
                           (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                            (FieldDescriptor *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        (*pMVar5->_vptr_MapFieldBase[9])(pMVar5,pMVar6);
      }
      else {
        pRVar7 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                           (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                            (FieldDescriptor *)
                            CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        this_00 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                            (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        pRVar4 = pRVar7;
        pAVar10 = internal::RepeatedPtrFieldBase::GetArenaNoVirtual(this_00);
        pAVar11 = internal::RepeatedPtrFieldBase::GetArenaNoVirtual(pRVar4);
        if (pAVar10 == pAVar11) {
          internal::RepeatedPtrFieldBase::InternalSwap(pRVar4,pRVar7);
        }
        else {
          internal::RepeatedPtrFieldBase::
          SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    ((RepeatedPtrFieldBase *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        }
      }
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffd70,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      iVar3 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58);
      FieldDescriptor::cpp_type((FieldDescriptor *)0x41a196);
      internal::LogMessage::operator<<(in_stack_fffffffffffffdf0,iVar3);
      internal::LogFinisher::operator=
                ((LogFinisher *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (LogMessage *)in_stack_fffffffffffffd58);
      internal::LogMessage::~LogMessage((LogMessage *)0x41a1e1);
    }
  }
  else {
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x41a219);
    iVar3 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    pLVar17 = (LogMessage *)(ulong)(CVar2 - CPPTYPE_INT32);
    switch(pLVar17) {
    case (LogMessage *)0x0:
      piVar8 = MutableRaw<int>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                               (FieldDescriptor *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      piVar9 = MutableRaw<int>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                               (FieldDescriptor *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<int>(piVar8,piVar9);
      break;
    case (LogMessage *)0x1:
      __a = MutableRaw<long>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b = MutableRaw<long>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<long>(__a,__b);
      break;
    case (LogMessage *)0x2:
      __a_00 = MutableRaw<unsigned_int>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b_00 = MutableRaw<unsigned_int>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<unsigned_int>(__a_00,__b_00);
      break;
    case (LogMessage *)0x3:
      __a_01 = MutableRaw<unsigned_long>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b_01 = MutableRaw<unsigned_long>
                         (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<unsigned_long>(__a_01,__b_01);
      break;
    case (LogMessage *)0x4:
      __a_03 = MutableRaw<double>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                  (FieldDescriptor *)
                                  CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b_03 = MutableRaw<double>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                  (FieldDescriptor *)
                                  CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<double>(__a_03,__b_03);
      break;
    case (LogMessage *)0x5:
      __a_02 = MutableRaw<float>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                 (FieldDescriptor *)
                                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b_02 = MutableRaw<float>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                 (FieldDescriptor *)
                                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<float>(__a_02,__b_02);
      break;
    case (LogMessage *)0x6:
      __a_04 = MutableRaw<bool>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                (FieldDescriptor *)
                                CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      __b_04 = MutableRaw<bool>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                                (FieldDescriptor *)
                                CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<bool>(__a_04,__b_04);
      break;
    case (LogMessage *)0x7:
      piVar8 = MutableRaw<int>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                               (FieldDescriptor *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      piVar9 = MutableRaw<int>(in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                               (FieldDescriptor *)
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      std::swap<int>(piVar8,piVar9);
      break;
    case (LogMessage *)0x8:
      FieldDescriptor::options(in_RCX);
      FieldOptions::ctype((FieldOptions *)0x41a73f);
      pAVar10 = GetArena((Reflection *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                         ,(Message *)in_stack_fffffffffffffd58);
      pAVar11 = GetArena((Reflection *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                         ,(Message *)in_stack_fffffffffffffd58);
      bVar1 = IsInlined((Reflection *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (FieldDescriptor *)in_stack_fffffffffffffd58);
      if (bVar1) {
        pIVar15 = MutableRaw<google::protobuf::internal::InlinedStringField>
                            (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        MutableRaw<google::protobuf::internal::InlinedStringField>
                  (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                   (FieldDescriptor *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60))
        ;
        std::__cxx11::string::swap((string *)pIVar15);
      }
      else {
        this_01 = MutableRaw<google::protobuf::internal::ArenaStringPtr>
                            (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        local_f8 = MutableRaw<google::protobuf::internal::ArenaStringPtr>
                             (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        this_02 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>
                            ((Reflection *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                             (FieldDescriptor *)in_stack_fffffffffffffd58);
        local_100 = internal::ArenaStringPtr::Get_abi_cxx11_(this_02);
        if (pAVar10 == pAVar11) {
          std::swap<std::__cxx11::string*>(&this_01->ptr_,&local_f8->ptr_);
        }
        else {
          psVar16 = internal::ArenaStringPtr::Get_abi_cxx11_(this_01);
          std::__cxx11::string::string(local_120,(string *)psVar16);
          internal::ArenaStringPtr::Get_abi_cxx11_(local_f8);
          internal::ArenaStringPtr::Set
                    ((ArenaStringPtr *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
          internal::ArenaStringPtr::Set
                    ((ArenaStringPtr *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     (string *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
          std::__cxx11::string::~string(local_120);
        }
      }
      break;
    case (LogMessage *)0x9:
      pAVar10 = GetArena((Reflection *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                         ,(Message *)in_stack_fffffffffffffd58);
      pAVar11 = GetArena((Reflection *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                         ,(Message *)in_stack_fffffffffffffd58);
      if (pAVar10 == pAVar11) {
        ppMVar12 = MutableRaw<google::protobuf::Message*>
                             (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        ppMVar13 = MutableRaw<google::protobuf::Message*>
                             (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        std::swap<google::protobuf::Message*>(ppMVar12,ppMVar13);
      }
      else {
        ppMVar12 = MutableRaw<google::protobuf::Message*>
                             (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        ppMVar13 = MutableRaw<google::protobuf::Message*>
                             (in_stack_fffffffffffffd70,(Message *)in_stack_fffffffffffffd68,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        if ((*ppMVar12 != (Message *)0x0) || (*ppMVar13 != (Message *)0x0)) {
          if ((*ppMVar12 == (Message *)0x0) || (*ppMVar13 == (Message *)0x0)) {
            if (*ppMVar12 == (Message *)0x0) {
              pMVar18 = *ppMVar13;
              uVar14 = (**(code **)(*in_RSI + 0x28))();
              iVar3 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[4])(pMVar18,uVar14);
              *ppMVar12 = (Message *)CONCAT44(extraout_var,iVar3);
              (*((*ppMVar12)->super_MessageLite)._vptr_MessageLite[0x10])(*ppMVar12,*ppMVar13);
              ClearField(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0);
            }
            else {
              pMVar18 = *ppMVar12;
              uVar14 = (**(code **)(*in_RDX + 0x28))();
              iVar3 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[4])(pMVar18,uVar14);
              *ppMVar13 = (Message *)CONCAT44(extraout_var_00,iVar3);
              (*((*ppMVar13)->super_MessageLite)._vptr_MessageLite[0x10])(*ppMVar13,*ppMVar12);
              ClearField(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                         in_stack_fffffffffffffdd0);
            }
          }
          else {
            Message::GetReflection
                      ((Message *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
            Swap(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          }
        }
      }
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffd70,
                 (LogLevel_conflict)((ulong)local_158 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      internal::LogMessage::operator<<
                ((LogMessage *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58);
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x41aa12);
      pLVar17 = internal::LogMessage::operator<<(pLVar17,iVar3);
      internal::LogFinisher::operator=
                ((LogFinisher *)CONCAT44(CVar2,in_stack_fffffffffffffd60),pLVar17);
      internal::LogMessage::~LogMessage((LogMessage *)0x41aa4c);
    }
  }
  return;
}

Assistant:

void Reflection::SwapField(Message* message1, Message* message2,
                           const FieldDescriptor* field) const {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                         \
    MutableRaw<RepeatedField<TYPE> >(message1, field)              \
        ->Swap(MutableRaw<RepeatedField<TYPE> >(message2, field)); \
    break;

      SWAP_ARRAYS(INT32, int32);
      SWAP_ARRAYS(INT64, int64);
      SWAP_ARRAYS(UINT32, uint32);
      SWAP_ARRAYS(UINT64, uint64);
      SWAP_ARRAYS(FLOAT, float);
      SWAP_ARRAYS(DOUBLE, double);
      SWAP_ARRAYS(BOOL, bool);
      SWAP_ARRAYS(ENUM, int);
#undef SWAP_ARRAYS

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrFieldBase>(message1, field)
                ->Swap<GenericTypeHandler<std::string> >(
                    MutableRaw<RepeatedPtrFieldBase>(message2, field));
            break;
        }
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message1, field)
              ->Swap(MutableRaw<MapFieldBase>(message2, field));
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message1, field)
              ->Swap<GenericTypeHandler<Message> >(
                  MutableRaw<RepeatedPtrFieldBase>(message2, field));
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  } else {
    switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    std::swap(*MutableRaw<TYPE>(message1, field),  \
              *MutableRaw<TYPE>(message2, field)); \
    break;

      SWAP_VALUES(INT32, int32);
      SWAP_VALUES(INT64, int64);
      SWAP_VALUES(UINT32, uint32);
      SWAP_VALUES(UINT64, uint64);
      SWAP_VALUES(FLOAT, float);
      SWAP_VALUES(DOUBLE, double);
      SWAP_VALUES(BOOL, bool);
      SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (GetArena(message1) == GetArena(message2)) {
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
        } else {
          Message** sub_msg1 = MutableRaw<Message*>(message1, field);
          Message** sub_msg2 = MutableRaw<Message*>(message2, field);
          if (*sub_msg1 == nullptr && *sub_msg2 == nullptr) break;
          if (*sub_msg1 && *sub_msg2) {
            (*sub_msg1)->GetReflection()->Swap(*sub_msg1, *sub_msg2);
            break;
          }
          if (*sub_msg1 == nullptr) {
            *sub_msg1 = (*sub_msg2)->New(message1->GetArena());
            (*sub_msg1)->CopyFrom(**sub_msg2);
            ClearField(message2, field);
          } else {
            *sub_msg2 = (*sub_msg1)->New(message2->GetArena());
            (*sub_msg2)->CopyFrom(**sub_msg1);
            ClearField(message1, field);
          }
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING: {
            Arena* arena1 = GetArena(message1);
            Arena* arena2 = GetArena(message2);

            if (IsInlined(field)) {
              InlinedStringField* string1 =
                  MutableRaw<InlinedStringField>(message1, field);
              InlinedStringField* string2 =
                  MutableRaw<InlinedStringField>(message2, field);
              string1->Swap(string2);
              break;
            }

            ArenaStringPtr* string1 =
                MutableRaw<ArenaStringPtr>(message1, field);
            ArenaStringPtr* string2 =
                MutableRaw<ArenaStringPtr>(message2, field);
            const std::string* default_ptr =
                &DefaultRaw<ArenaStringPtr>(field).Get();
            if (arena1 == arena2) {
              string1->Swap(string2, default_ptr, arena1);
            } else {
              const std::string temp = string1->Get();
              string1->Set(default_ptr, string2->Get(), arena1);
              string2->Set(default_ptr, temp, arena2);
            }
          } break;
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  }
}